

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t3std.h
# Opt level: O0

char * lib_strnchr(char *src,size_t len,int ch)

{
  bool bVar1;
  int ch_local;
  size_t len_local;
  char *src_local;
  
  len_local = len;
  src_local = src;
  while( true ) {
    bVar1 = false;
    if (len_local != 0) {
      bVar1 = *src_local != '\0';
    }
    if (!bVar1) break;
    if (*src_local == ch) {
      return src_local;
    }
    len_local = len_local - 1;
    src_local = src_local + 1;
  }
  return (char *)0x0;
}

Assistant:

inline char *lib_strnchr(const char *src, size_t len, int ch)
{
    /* search until we exhaust the length limit or reach a null byte */
    for ( ; len != 0 && *src != '\0' ; --len, ++src)
    {
        /* if this is the character we're looking for, return the pointer */
        if (*src == ch)
            return (char *)src;
    }

    /* didn't find it */
    return 0;
}